

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O1

void __thiscall
soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::~ArrayWithPreallocation
          (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> *this)

{
  this->numActive = 0;
  if (2 < this->numAllocated) {
    if (this->items != (pool_ref<soul::AST::Expression> *)0x0) {
      operator_delete__(this->items);
    }
    this->items = (pool_ref<soul::AST::Expression> *)this->space;
    this->numAllocated = 2;
  }
  return;
}

Assistant:

void clear() noexcept
    {
        for (size_t i = 0; i < numActive; ++i)
            items[i].~Item();

        numActive = 0;
        freeIfHeapAllocated();
    }